

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramActiveUniformNameCase::test
          (ProgramActiveUniformNameCase *this)

{
  TestContext *testCtx;
  char *pcVar1;
  GLuint GVar2;
  int iVar3;
  qpTestResult qVar4;
  GLenum GVar5;
  uint (*pauVar6) [3];
  int *piVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  CallLogWrapper *this_00;
  MessageBuilder local_da8;
  MessageBuilder local_c28;
  allocator<char> local_aa1;
  string local_aa0 [36];
  GLenum local_a7c [2];
  GLint referenceLength_1;
  GLenum type;
  GLint size;
  GLint written;
  GLuint uniformIndex_1;
  char buffer [2048];
  undefined1 local_260 [4];
  int ndx_1;
  allocator<char> local_d9;
  string local_d8 [36];
  int local_b4;
  undefined1 local_b0 [4];
  GLint referenceLength;
  StateQueryMemoryWriteGuard<int> uniformNameLen;
  GLuint uniformIndex;
  int ndx;
  StateQueryMemoryWriteGuard<unsigned_int[3]> uniformIndices;
  char *uniformNames [3];
  allocator<char> local_41;
  string local_40 [36];
  GLuint local_1c;
  GLuint local_18;
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  ProgramActiveUniformNameCase *this_local;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  _shaderFrag = this;
  program = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  local_18 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,program,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,local_18,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,program);
  glu::CallLogWrapper::glCompileShader(this_00,local_18);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_1c = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,local_1c,program);
  glu::CallLogWrapper::glAttachShader(this_00,local_1c,local_18);
  glu::CallLogWrapper::glLinkProgram(this_00,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,local_1c,0x8b86,3);
  GVar2 = local_1c;
  testCtx = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"uniformNameWithLength23",&local_41);
  iVar3 = std::__cxx11::string::length();
  verifyProgramParam(testCtx,this_00,GVar2,0x8b87,iVar3 + 1);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  ApiCase::expectError(&this->super_ApiCase,0);
  uniformIndices.m_postguard._4_8_ = anon_var_dwarf_42e90c;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<unsigned_int[3]> *)&uniformIndex);
  GVar2 = local_1c;
  pauVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)&uniformIndex);
  glu::CallLogWrapper::glGetUniformIndices
            (&(this->super_ApiCase).super_CallLogWrapper,GVar2,3,
             (GLchar **)(uniformIndices.m_postguard + 1),*pauVar6);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::verifyValidity
            ((StateQueryMemoryWriteGuard<unsigned_int[3]> *)&uniformIndex,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  for (uniformNameLen.m_postguard = 0; uniformNameLen.m_postguard < 3;
      uniformNameLen.m_postguard = uniformNameLen.m_postguard + 1) {
    pauVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&uniformIndex);
    uniformNameLen.m_value = (*pauVar6)[uniformNameLen.m_postguard];
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_b0);
    GVar2 = local_1c;
    piVar7 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                       ((StateQueryMemoryWriteGuard<int> *)local_b0);
    glu::CallLogWrapper::glGetActiveUniformsiv
              (&(this->super_ApiCase).super_CallLogWrapper,GVar2,1,(GLuint *)&uniformNameLen.m_value
               ,0x8a39,piVar7);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
              ((StateQueryMemoryWriteGuard<int> *)local_b0,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    pcVar1 = uniformNames[(long)uniformNameLen.m_postguard + -1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d8,pcVar1,&local_d9);
    iVar3 = std::__cxx11::string::length();
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    local_b4 = iVar3 + 1;
    piVar7 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_b0);
    if (iVar3 + 1 != *piVar7) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_260,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_260,(char (*) [20])"// ERROR: Expected ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_b4);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [5])0x12f046e);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(StateQueryMemoryWriteGuard<int> *)local_b0);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_260);
      qVar4 = tcu::TestContext::getTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
      if (qVar4 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
  }
  buffer[0x7fc] = '\0';
  buffer[0x7fd] = '\0';
  buffer[0x7fe] = '\0';
  buffer[0x7ff] = '\0';
  for (; (int)buffer._2044_4_ < 3; buffer._2044_4_ = buffer._2044_4_ + 1) {
    memset(&written,0,0x800);
    written._0_1_ = 0x78;
    pauVar6 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&uniformIndex);
    size = (*pauVar6)[(int)buffer._2044_4_];
    type = 0;
    referenceLength_1 = 0;
    local_a7c[1] = 0;
    glu::CallLogWrapper::glGetActiveUniform
              (&(this->super_ApiCase).super_CallLogWrapper,local_1c,size,0x800,(GLsizei *)&type,
               &referenceLength_1,local_a7c + 1,(GLchar *)&written);
    pcVar1 = uniformNames[(long)(int)buffer._2044_4_ + -1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_aa0,pcVar1,&local_aa1);
    GVar5 = std::__cxx11::string::length();
    std::__cxx11::string::~string(local_aa0);
    std::allocator<char>::~allocator(&local_aa1);
    local_a7c[0] = GVar5;
    if (GVar5 != type) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_c28,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_c28,(char (*) [20])"// ERROR: Expected ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)local_a7c);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [5])0x12f046e);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&type);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_c28);
      qVar4 = tcu::TestContext::getTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
      if (qVar4 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
    type = 0;
    glu::CallLogWrapper::glGetActiveUniform
              (&(this->super_ApiCase).super_CallLogWrapper,local_1c,size,1,(GLsizei *)&type,
               &referenceLength_1,local_a7c + 1,(GLchar *)&written);
    if (type != 0) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(&local_da8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_da8,(char (*) [26])"// ERROR: Expected 0 got ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&type);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_da8);
      qVar4 = tcu::TestContext::getTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
      if (qVar4 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"got wrong uniform name length");
      }
    }
  }
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,local_18);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"uniform highp float uniformNameWithLength23;\n"
			"uniform highp vec2 uniformVec2;\n"
			"uniform highp mat4 uniformMat4;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0) + vec4(uniformNameWithLength23) + vec4(uniformVec2.x) + vec4(uniformMat4[2][3]);\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_UNIFORMS, 3);
		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_UNIFORM_MAX_LENGTH, (GLint)std::string("uniformNameWithLength23").length() + 1); // including a null terminator
		expectError(GL_NO_ERROR);

		const char* uniformNames[] =
		{
			"uniformNameWithLength23",
			"uniformVec2",
			"uniformMat4"
		};
		StateQueryMemoryWriteGuard<GLuint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformIndices;
		glGetUniformIndices(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformNames, uniformIndices);
		uniformIndices.verifyValidity(m_testCtx);

		// check name lengths
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformNames); ++ndx)
		{
			const GLuint uniformIndex = uniformIndices[ndx];

			StateQueryMemoryWriteGuard<GLint> uniformNameLen;
			glGetActiveUniformsiv(program, 1, &uniformIndex, GL_UNIFORM_NAME_LENGTH, &uniformNameLen);

			uniformNameLen.verifyValidity(m_testCtx);

			const GLint referenceLength = (GLint)std::string(uniformNames[ndx]).length() + 1;
			if (referenceLength != uniformNameLen) // uniformNameLen is with null terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << referenceLength << "got " << uniformNameLen << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}
		}

		// check names
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformNames); ++ndx)
		{
			char buffer[2048] = {'x'};

			const GLuint uniformIndex = uniformIndices[ndx];

			GLint written = 0; // null terminator not included
			GLint size = 0;
			GLenum type = 0;
			glGetActiveUniform(program, uniformIndex, DE_LENGTH_OF_ARRAY(buffer), &written, &size, &type, buffer);

			const GLint referenceLength = (GLint)std::string(uniformNames[ndx]).length();
			if (referenceLength != written)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected " << referenceLength << "got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}

			// and with too small buffer
			written = 0;
			glGetActiveUniform(program, uniformIndex, 1, &written, &size, &type, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 0 got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform name length");
			}
		}


		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}